

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O3

void __thiscall
Fl_Text_Display::update_line_starts
          (Fl_Text_Display *this,int pos,int charsInserted,int charsDeleted,int linesInserted,
          int linesDeleted,int *scrolled)

{
  int endLine;
  int *piVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  int local_3c;
  int local_38;
  int local_34;
  
  piVar1 = this->mLineStarts;
  endLine = this->mNVisibleLines;
  lVar5 = (long)endLine;
  iVar4 = charsInserted - charsDeleted;
  uVar6 = linesInserted - linesDeleted;
  iVar2 = this->mFirstChar;
  if (charsDeleted + pos < iVar2) {
    this->mTopLineNum = this->mTopLineNum + uVar6;
    if (0 < endLine) {
      lVar3 = 0;
      do {
        if (piVar1[lVar3] == -1) break;
        piVar1[lVar3] = piVar1[lVar3] + iVar4;
        lVar3 = lVar3 + 1;
      } while (lVar5 != lVar3);
      iVar2 = this->mFirstChar;
    }
    this->mFirstChar = iVar2 + iVar4;
    this->mLastChar = this->mLastChar + iVar4;
    iVar2 = 0;
    goto LAB_001d4421;
  }
  if (iVar2 <= pos) {
    if (this->mLastChar < pos) {
      iVar2 = 0;
      if ((0 < endLine) && (piVar1[lVar5 + -1] == -1)) {
        position_to_line(this,pos,&local_3c);
        calc_line_starts(this,local_3c,linesInserted + local_3c);
        calc_last_char(this);
        iVar2 = 0;
      }
    }
    else {
      local_38 = linesInserted;
      position_to_line(this,pos,&local_3c);
      if (local_38 == linesDeleted) {
        if (local_3c + 1 < endLine) {
          lVar5 = (long)local_3c;
          do {
            if (piVar1[lVar5 + 1] == -1) break;
            piVar1[lVar5 + 1] = piVar1[lVar5 + 1] + iVar4;
            lVar5 = lVar5 + 1;
          } while (endLine + -1 != (int)lVar5);
        }
      }
      else if ((int)uVar6 < 1) {
        iVar2 = -1;
        if (-1 < local_3c) {
          iVar2 = local_3c;
        }
        if (iVar2 + 1 < (int)(endLine + uVar6)) {
          iVar2 = -1;
          if (-1 < local_3c) {
            iVar2 = local_3c;
          }
          lVar5 = (long)iVar2 + 1;
          do {
            iVar2 = iVar4;
            if (piVar1[(linesDeleted + lVar5) - (long)local_38] == -1) {
              iVar2 = 0;
            }
            piVar1[lVar5] = iVar2 + piVar1[(linesDeleted + lVar5) - (long)local_38];
            lVar5 = lVar5 + 1;
          } while (lVar5 < (long)(ulong)(endLine + uVar6));
        }
      }
      else {
        iVar2 = uVar6 + local_3c + 1;
        if (iVar2 < endLine) {
          do {
            iVar7 = iVar4;
            if (piVar1[(lVar5 + -1) - (ulong)uVar6] == -1) {
              iVar7 = 0;
            }
            piVar1[lVar5 + -1] = iVar7 + piVar1[(lVar5 + -1) - (ulong)uVar6];
            lVar5 = lVar5 + -1;
          } while (iVar2 < lVar5);
        }
      }
      if (-1 < local_38) {
        calc_line_starts(this,local_3c + 1,local_38 + local_3c);
      }
      if ((int)uVar6 < 0) {
        calc_line_starts(this,uVar6 + endLine,endLine);
      }
      calc_last_char(this);
      iVar2 = 0;
    }
    goto LAB_001d4421;
  }
  iVar2 = position_to_line(this,charsDeleted + pos,&local_34);
  if (iVar2 == 0) {
LAB_001d428b:
    if ((int)(uVar6 + this->mNBufferLines) < this->mTopLineNum) {
      this->mTopLineNum = 1;
      iVar2 = 0;
    }
    else {
      iVar2 = skip_lines(this,0,this->mTopLineNum + -1,true);
    }
  }
  else {
    if ((endLine <= local_34 + 1) || (piVar1[(long)local_34 + 1] == -1)) goto LAB_001d428b;
    iVar7 = uVar6 + this->mTopLineNum;
    iVar2 = 1;
    if (1 < iVar7) {
      iVar2 = iVar7;
    }
    this->mTopLineNum = iVar2;
    iVar2 = rewind_lines(this,iVar4 + piVar1[(long)local_34 + 1],local_34 + 1);
  }
  this->mFirstChar = iVar2;
  calc_line_starts(this,0,endLine + -1);
  calc_last_char(this);
  iVar2 = 1;
LAB_001d4421:
  *scrolled = iVar2;
  return;
}

Assistant:

void Fl_Text_Display::update_line_starts(int pos, int charsInserted,
                                         int charsDeleted, int linesInserted,
                                         int linesDeleted, int *scrolled ) {
  IS_UTF8_ALIGNED2(buffer(), pos)

  int *lineStarts = mLineStarts;
  int i, lineOfPos, lineOfEnd, nVisLines = mNVisibleLines;
  int charDelta = charsInserted - charsDeleted;
  int lineDelta = linesInserted - linesDeleted;

  /* If all of the changes were before the displayed text, the display
   doesn't change, just update the top line num and offset the line
   start entries and first and last characters */
  if ( pos + charsDeleted < mFirstChar ) {
    mTopLineNum += lineDelta;
    for ( i = 0; i < nVisLines && lineStarts[i] != -1; i++ )
      lineStarts[ i ] += charDelta;
    mFirstChar += charDelta;
    mLastChar += charDelta;
    *scrolled = 0;
    return;
  }

  /* The change began before the beginning of the displayed text, but
   part or all of the displayed text was deleted */
  if ( pos < mFirstChar ) {
    /* If some text remains in the window, anchor on that  */
    if ( position_to_line( pos + charsDeleted, &lineOfEnd ) &&
        ++lineOfEnd < nVisLines && lineStarts[ lineOfEnd ] != -1 ) {
      mTopLineNum = max( 1, mTopLineNum + lineDelta );
      mFirstChar = rewind_lines(lineStarts[ lineOfEnd ] + charDelta, lineOfEnd );
      /* Otherwise anchor on original line number and recount everything */
    } else {
      if ( mTopLineNum > mNBufferLines + lineDelta ) {
        mTopLineNum = 1;
        mFirstChar = 0;
      } else
        mFirstChar = skip_lines( 0, mTopLineNum - 1, true );
    }
    calc_line_starts( 0, nVisLines - 1 );
    /* calculate lastChar by finding the end of the last displayed line */
    calc_last_char();
    *scrolled = 1;
    return;
  }

  /* If the change was in the middle of the displayed text (it usually is),
   salvage as much of the line starts array as possible by moving and
   offsetting the entries after the changed area, and re-counting the
   added lines or the lines beyond the salvaged part of the line starts
   array */
  if ( pos <= mLastChar ) {
    /* find line on which the change began */
    position_to_line( pos, &lineOfPos );
    /* salvage line starts after the changed area */
    if ( lineDelta == 0 ) {
      for ( i = lineOfPos + 1; i < nVisLines && lineStarts[ i ] != -1; i++ )
        lineStarts[ i ] += charDelta;
    } else if ( lineDelta > 0 ) {
      for ( i = nVisLines - 1; i >= lineOfPos + lineDelta + 1; i-- )
        lineStarts[ i ] = lineStarts[ i - lineDelta ] +
        ( lineStarts[ i - lineDelta ] == -1 ? 0 : charDelta );
    } else /* (lineDelta < 0) */ {
      for ( i = max( 0, lineOfPos + 1 ); i < nVisLines + lineDelta; i++ )
        lineStarts[ i ] = lineStarts[ i - lineDelta ] +
        ( lineStarts[ i - lineDelta ] == -1 ? 0 : charDelta );
    }
    /* fill in the missing line starts */
    if ( linesInserted >= 0 )
      calc_line_starts( lineOfPos + 1, lineOfPos + linesInserted );
    if ( lineDelta < 0 )
      calc_line_starts( nVisLines + lineDelta, nVisLines );
    /* calculate lastChar by finding the end of the last displayed line */
    calc_last_char();
    *scrolled = 0;
    return;
  }

  /* Change was past the end of the displayed text, but displayable by virtue
   of being an insert at the end of the buffer into visible blank lines */
  if ( empty_vlines() ) {
    position_to_line( pos, &lineOfPos );
    calc_line_starts( lineOfPos, lineOfPos + linesInserted );
    calc_last_char();
    *scrolled = 0;
    return;
  }

  /* Change was beyond the end of the buffer and not visible, do nothing */
  *scrolled = 0;
}